

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O3

void VW_CopyModelData(VW_HANDLE handle,VW_IOBUF *outputBufferHandle,char **outputData,
                     size_t *outputSize)

{
  pointer pcVar1;
  memory_io_buf *this;
  
  this = (memory_io_buf *)operator_new(200);
  memory_io_buf::memory_io_buf(this);
  VW::save_predictor((vw *)handle,(io_buf *)this);
  *outputBufferHandle = this;
  pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *outputSize = (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar1;
  *outputData = pcVar1;
  return;
}

Assistant:

VW_DLL_MEMBER void VW_CALLING_CONV VW_CopyModelData(VW_HANDLE handle, VW_IOBUF* outputBufferHandle, char** outputData, size_t* outputSize) {
    vw* pointer = static_cast<vw*>(handle);

    memory_io_buf* buf = new(memory_io_buf);
    VW::save_predictor(*pointer, *buf);

    *outputBufferHandle = buf;
    *outputSize = buf->GetDataSize();
    *outputData = buf->GetDataPointer();
}